

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::ServiceDescriptorProto::IsInitialized(ServiceDescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  MethodDescriptorProto *pMVar4;
  ServiceOptions *pSVar5;
  int local_1c;
  int i;
  ServiceDescriptorProto *this_local;
  
  for (local_1c = 0; iVar2 = method_size(this), local_1c < iVar2; local_1c = local_1c + 1) {
    pMVar4 = method(this,local_1c);
    uVar3 = (*(pMVar4->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  bVar1 = has_options(this);
  if (bVar1) {
    pSVar5 = options(this);
    uVar3 = (*(pSVar5->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ServiceDescriptorProto::IsInitialized() const {

  for (int i = 0; i < method_size(); i++) {
    if (!this->method(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}